

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_dyn_vector.cpp
# Opt level: O1

void msd_D<vector_bagwell<unsigned_char*,16u>,unsigned_long>
               (uchar **strings,size_t n,size_t depth,vector_bagwell<unsigned_char_*,_16U> *buckets)

{
  uchar *puVar1;
  uchar *puVar2;
  size_t n_00;
  int iVar3;
  uint j;
  long lVar4;
  pointer pppuVar5;
  uchar **ppuVar6;
  size_t sVar7;
  pointer pppuVar8;
  vector_bagwell<unsigned_char_*,_16U> *pvVar9;
  size_t __n;
  ulong uVar10;
  long lVar11;
  uchar **ppuVar12;
  byte bVar13;
  byte bVar14;
  uint i_1;
  long lVar15;
  uint j_1;
  array<unsigned_long,_256UL> bucketsize;
  size_t local_838 [257];
  
  if (n < 0x20) {
    if (1 < (long)n) {
      ppuVar6 = strings;
      do {
        iVar3 = (int)n;
        n = (size_t)(iVar3 - 1);
        puVar1 = ppuVar6[1];
        ppuVar6 = ppuVar6 + 1;
        for (ppuVar12 = ppuVar6; strings < ppuVar12; ppuVar12 = ppuVar12 + -1) {
          puVar2 = ppuVar12[-1];
          bVar13 = puVar2[depth];
          bVar14 = puVar1[depth];
          if ((bVar13 != 0) && (lVar4 = depth + 1, bVar13 == bVar14)) {
            do {
              bVar13 = puVar2[lVar4];
              bVar14 = puVar1[lVar4];
              if (bVar13 == 0) break;
              lVar4 = lVar4 + 1;
            } while (bVar13 == bVar14);
          }
          if (bVar13 <= bVar14) break;
          *ppuVar12 = puVar2;
        }
        *ppuVar12 = puVar1;
      } while (2 < iVar3);
    }
  }
  else {
    if ((n & 0xffffffffffffffe0) == 0) {
      uVar10 = 0;
    }
    else {
      uVar10 = 0;
      ppuVar6 = strings;
      do {
        lVar4 = 0;
        do {
          *(uchar *)((long)local_838 + lVar4) = ppuVar6[lVar4][depth];
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0x20);
        lVar4 = 0;
        ppuVar12 = ppuVar6;
        do {
          vector_bagwell<unsigned_char_*,_16U>::push_back
                    (buckets + *(byte *)((long)local_838 + lVar4),ppuVar12);
          lVar4 = lVar4 + 1;
          ppuVar12 = ppuVar12 + 1;
        } while (lVar4 != 0x20);
        uVar10 = uVar10 + 0x20;
        ppuVar6 = ppuVar6 + 0x20;
      } while (uVar10 < (n & 0xffffffffffffffe0));
    }
    lVar4 = n - uVar10;
    if (uVar10 <= n && lVar4 != 0) {
      ppuVar6 = strings + uVar10;
      do {
        vector_bagwell<unsigned_char_*,_16U>::push_back(buckets + (*ppuVar6)[depth],ppuVar6);
        ppuVar6 = ppuVar6 + 1;
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
    }
    lVar4 = 0;
    pvVar9 = buckets;
    do {
      if (pvVar9->_insertpos == (uchar **)0x0) {
        sVar7 = 0;
      }
      else {
        pppuVar5 = (pvVar9->_index_block).
                   super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        sVar7 = (long)pvVar9->_insertpos +
                ((long)((1 << ((char)((uint)((int)pppuVar5 -
                                            *(int *)&(pvVar9->_index_block).
                                                                                                          
                                                  super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) +
                               3U & 0x1f)) + -0x10) * 8 - (long)pppuVar5[-1]) >> 3;
      }
      local_838[lVar4] = sVar7;
      lVar4 = lVar4 + 1;
      pvVar9 = pvVar9 + 1;
    } while (lVar4 != 0x100);
    lVar15 = 0;
    lVar4 = 0;
    do {
      sVar7 = local_838[lVar15];
      if (sVar7 != 0) {
        pvVar9 = buckets + lVar15;
        ppuVar6 = strings + lVar4;
        pppuVar5 = (pvVar9->_index_block).
                   super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                   super__Vector_impl_data._M_start;
        pppuVar8 = (pvVar9->_index_block).
                   super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        if (8 < (ulong)((long)pppuVar8 - (long)pppuVar5)) {
          lVar11 = 0x10;
          uVar10 = 1;
          do {
            if (lVar11 != 0) {
              memmove(ppuVar6,pppuVar5[uVar10 - 1],lVar11 * 8);
            }
            ppuVar6 = ppuVar6 + lVar11;
            lVar11 = lVar11 * 2;
            uVar10 = uVar10 + 1;
            pppuVar5 = (pvVar9->_index_block).
                       super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                       _M_impl.super__Vector_impl_data._M_start;
            pppuVar8 = (pvVar9->_index_block).
                       super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
          } while (uVar10 < (ulong)((long)pppuVar8 - (long)pppuVar5 >> 3));
        }
        __n = (long)pvVar9->_insertpos - (long)pppuVar8[-1];
        if (__n != 0) {
          memmove(ppuVar6,pppuVar8[-1],__n);
        }
        lVar4 = lVar4 + sVar7;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != 0x100);
    lVar4 = 0;
    do {
      vector_bagwell<unsigned_char_*,_16U>::clear
                ((vector_bagwell<unsigned_char_*,_16U> *)
                 ((long)&(buckets->_index_block).
                         super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar4));
      lVar4 = lVar4 + 0x28;
    } while (lVar4 != 0x2800);
    lVar4 = 1;
    sVar7 = local_838[0];
    do {
      n_00 = local_838[lVar4];
      if (n_00 != 0) {
        msd_D<vector_bagwell<unsigned_char*,16u>,unsigned_long>
                  (strings + sVar7,n_00,depth + 1,buckets);
        sVar7 = sVar7 + n_00;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x100);
  }
  return;
}

Assistant:

static void
msd_D(unsigned char** strings, size_t n, size_t depth, Bucket* buckets)
{
	if (n < 32) {
		insertion_sort(strings, n, depth);
		return;
	}
	// Use a small cache to reduce memory stalls.
	size_t i=0;
	for (; i < n-n%32; i+=32) {
		unsigned char cache[32];
		for (unsigned j=0; j < 32; ++j) {
			cache[j] = strings[i+j][depth];
		}
		for (unsigned j=0; j < 32; ++j) {
			buckets[cache[j]].push_back(strings[i+j]);
		}
	}
	for (; i < n; ++i) {
		buckets[strings[i][depth]].push_back(strings[i]);
	}
	std::array<BucketsizeType, 256> bucketsize;
	for (unsigned i=0; i < 256; ++i) {
		bucketsize[i] = buckets[i].size();
	}
	size_t pos = 0;
	for (unsigned i=0; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		copy(buckets[i], strings+pos);
		pos += bucketsize[i];
	}
	for (unsigned i=0; i < 256; ++i) {
		buckets[i].clear();
	}
	pos = bucketsize[0];
	for (unsigned i=1; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		msd_D<Bucket, BucketsizeType>(strings+pos, bucketsize[i], depth+1, buckets);
		pos += bucketsize[i];
	}
}